

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O2

int sptk::snack::xlpc(int lpc_ord,float lpc_stabl,int wsize,float *data,float *lpca,float *ar,
                     float *lpck,float *normerr,float *rms,float preemp,int type,int *nwindp,
                     float **dwindp,int *wsizep,float **windp)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  float *r;
  float fVar7;
  double dVar8;
  float er;
  float en;
  float *local_508;
  float *local_500;
  float rho [101];
  float k [100];
  float a [101];
  
  iVar6 = 0;
  if (((lpc_ord < 0x65) && (0 < wsize)) && (iVar6 = 0, data != (float *)0x0)) {
    pfVar1 = *dwindp;
    local_508 = lpca;
    if (*nwindp != wsize) {
      if (pfVar1 == (float *)0x0) {
        pfVar1 = (float *)malloc((ulong)(uint)wsize << 2);
      }
      else {
        pfVar1 = (float *)realloc(pfVar1,(ulong)(uint)wsize << 2);
      }
      if (pfVar1 == (float *)0x0) {
        fwrite("Can\'t allocate scratch memory in lpc()\n",0x27,1,_stderr);
        return 0;
      }
      *nwindp = wsize;
      *dwindp = pfVar1;
    }
    window(data,pfVar1,wsize,preemp,type,wsizep,windp);
    r = ar;
    if (ar == (float *)0x0) {
      r = rho;
    }
    local_500 = k;
    if (lpck != (float *)0x0) {
      local_500 = lpck;
    }
    pfVar2 = local_508;
    if (local_508 == (float *)0x0) {
      pfVar2 = a;
    }
    xautoc(wsize,pfVar1,lpc_ord,r,&en);
    if (1.0 < lpc_stabl) {
      dVar8 = exp(((double)lpc_stabl / 20.0) * -2.302585092994046);
      uVar3 = 0;
      uVar4 = 0;
      if (0 < lpc_ord) {
        uVar4 = (ulong)(uint)lpc_ord;
      }
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        rho[uVar3 + 1] = r[uVar3 + 1] * (float)(1.0 / (dVar8 + 1.0));
      }
      rho[0] = *r;
      if (ar != (float *)0x0) {
        for (lVar5 = 0; lVar5 <= lpc_ord; lVar5 = lVar5 + 1) {
          ar[lVar5] = rho[lVar5];
        }
      }
      r = rho;
    }
    pfVar1 = a;
    if (local_508 != (float *)0x0) {
      pfVar1 = local_508;
    }
    xdurbin(r,local_500,pfVar1 + 1,lpc_ord,&er);
    if (type - 1U < 3) {
      fVar7 = *(float *)(&DAT_00126728 + (ulong)(type - 1U) * 4);
    }
    else {
      fVar7 = 1.0;
    }
    *pfVar2 = 1.0;
    if (rms != (float *)0x0) {
      *rms = en / fVar7;
    }
    iVar6 = 1;
    if (normerr != (float *)0x0) {
      *normerr = er;
    }
  }
  return iVar6;
}

Assistant:

int xlpc(int lpc_ord, float lpc_stabl, int wsize, float *data, float *lpca,
         float *ar, float *lpck, float *normerr, float *rms, float preemp,
         int type, int *nwindp, float **dwindp, int *wsizep, float **windp)
#endif
{
#if 0
  static float *dwind=NULL;
  static int nwind=0;
#else
  float *dwind=*dwindp;
  int nwind=*nwindp;
#endif
  float rho[BIGSORD+1], k[BIGSORD], a[BIGSORD+1],*r,*kp,*ap,en,er,wfact=1.0;

  if((wsize <= 0) || (!data) || (lpc_ord > BIGSORD)) return(FALSE);
  
  if(nwind != wsize) {
    if(dwind) dwind = (float*)ckrealloc((void *)dwind,wsize*sizeof(float));
    else dwind = (float*)ckalloc(wsize*sizeof(float));
    if(!dwind) {
      Fprintf(stderr,"Can't allocate scratch memory in lpc()\n");
      return(FALSE);
    }
    nwind = wsize;
#if 1
    *nwindp = nwind;
    *dwindp = dwind;
#endif
  }
  
#if 0
  window(data, dwind, wsize, preemp, type);
#else
  window(data, dwind, wsize, preemp, type, wsizep, windp);
#endif
  if(!(r = ar)) r = rho;	/* Permit optional return of the various */
  if(!(kp = lpck)) kp = k;	/* coefficients and intermediate results. */
  if(!(ap = lpca)) ap = a;
  xautoc( wsize, dwind, lpc_ord, r, &en );
  if(lpc_stabl > 1.0) {	/* add a little to the diagonal for stability */
    int i;
    float ffact;
    ffact = (float) (1.0/(1.0 + exp((-lpc_stabl/20.0) * log(10.0))));
    for(i=1; i <= lpc_ord; i++) rho[i] = ffact * r[i];
    *rho = *r;
    r = rho;
    if(ar)
      for(i=0;i<=lpc_ord; i++) ar[i] = r[i];
  }
  xdurbin ( r, kp, &ap[1], lpc_ord, &er);
  switch(type) {		/* rms correction for window */
  case 0:
    wfact = 1.0;		/* rectangular */
    break;
  case 1:
    wfact = .630397f;		/* Hamming */
    break;
  case 2:
    wfact = .443149f;		/* (.5 - .5*cos)^4 */
    break;
  case 3:
    wfact = .612372f;		/* Hanning */
    break;
  }
  *ap = 1.0;
  if(rms) *rms = en/wfact;
  if(normerr) *normerr = er;
  return(TRUE);
}